

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O3

void __thiscall
btPoint2PointConstraint::getInfo2NonVirtual
          (btPoint2PointConstraint *this,btConstraintInfo2 *info,btTransform *body0_trans,
          btTransform *body1_trans)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btScalar bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  btScalar *pbVar9;
  bool bVar10;
  btScalar bVar11;
  btVector3 a2;
  btVector3 a1;
  
  pbVar9 = info->m_J1linearAxis;
  *pbVar9 = 1.0;
  lVar6 = (long)info->rowskip;
  pbVar9[lVar6 + 1] = 1.0;
  pbVar9[lVar6 * 2 + 2] = 1.0;
  fVar1 = (this->m_pivotInA).m_floats[0];
  fVar2 = (this->m_pivotInA).m_floats[1];
  fVar3 = (this->m_pivotInA).m_floats[2];
  a1.m_floats[0] =
       fVar3 * (body0_trans->m_basis).m_el[0].m_floats[2] +
       fVar1 * (body0_trans->m_basis).m_el[0].m_floats[0] +
       (body0_trans->m_basis).m_el[0].m_floats[1] * fVar2;
  a1.m_floats[1] =
       fVar3 * (body0_trans->m_basis).m_el[1].m_floats[2] +
       fVar1 * (body0_trans->m_basis).m_el[1].m_floats[0] +
       (body0_trans->m_basis).m_el[1].m_floats[1] * fVar2;
  a1.m_floats[2] =
       fVar3 * (body0_trans->m_basis).m_el[2].m_floats[2] +
       fVar1 * (body0_trans->m_basis).m_el[2].m_floats[0] +
       fVar2 * (body0_trans->m_basis).m_el[2].m_floats[1];
  a1.m_floats[3] = 0.0;
  pbVar9 = info->m_J1angularAxis;
  lVar8 = 0;
  *pbVar9 = 0.0;
  pbVar9[1] = a1.m_floats[2];
  pbVar9[2] = -a1.m_floats[1];
  pbVar9[3] = 0.0;
  pbVar9[lVar6] = -a1.m_floats[2];
  pbVar9[lVar6 + 1] = 0.0;
  pbVar9[lVar6 + 2] = a1.m_floats[0];
  pbVar9[lVar6 + 3] = 0.0;
  pbVar9[lVar6 * 2] = a1.m_floats[1];
  pbVar9[lVar6 * 2 + 1] = -a1.m_floats[0];
  (pbVar9 + lVar6 * 2 + 2)[0] = 0.0;
  (pbVar9 + lVar6 * 2 + 2)[1] = 0.0;
  pbVar9 = info->m_J2linearAxis;
  *pbVar9 = -1.0;
  pbVar9[lVar6 + 1] = -1.0;
  pbVar9[lVar6 * 2 + 2] = -1.0;
  fVar1 = (this->m_pivotInB).m_floats[0];
  fVar2 = (this->m_pivotInB).m_floats[1];
  fVar3 = (this->m_pivotInB).m_floats[2];
  a2.m_floats[0] =
       fVar3 * (body1_trans->m_basis).m_el[0].m_floats[2] +
       fVar1 * (body1_trans->m_basis).m_el[0].m_floats[0] +
       (body1_trans->m_basis).m_el[0].m_floats[1] * fVar2;
  a2.m_floats[1] =
       fVar3 * (body1_trans->m_basis).m_el[1].m_floats[2] +
       fVar1 * (body1_trans->m_basis).m_el[1].m_floats[0] +
       (body1_trans->m_basis).m_el[1].m_floats[1] * fVar2;
  a2.m_floats[2] =
       fVar3 * (body1_trans->m_basis).m_el[2].m_floats[2] +
       fVar1 * (body1_trans->m_basis).m_el[2].m_floats[0] +
       fVar2 * (body1_trans->m_basis).m_el[2].m_floats[1];
  a2.m_floats[3] = 0.0;
  pbVar9 = info->m_J2angularAxis;
  *pbVar9 = 0.0;
  pbVar9[1] = -a2.m_floats[2];
  pbVar9[2] = a2.m_floats[1];
  pbVar9[3] = 0.0;
  pbVar9[lVar6] = a2.m_floats[2];
  pbVar9[lVar6 + 1] = 0.0;
  pbVar9[lVar6 + 2] = -a2.m_floats[0];
  pbVar9[lVar6 + 3] = 0.0;
  pbVar9[lVar6 * 2] = -a2.m_floats[1];
  pbVar9[lVar6 * 2 + 1] = a2.m_floats[0];
  (pbVar9 + lVar6 * 2 + 2)[0] = 0.0;
  (pbVar9 + lVar6 * 2 + 2)[1] = 0.0;
  uVar5 = this->m_flags;
  pbVar9 = &this->m_erp;
  if ((uVar5 & 1) == 0) {
    pbVar9 = &info->erp;
  }
  fVar1 = *pbVar9;
  fVar2 = info->fps;
  pbVar9 = info->m_constraintError;
  do {
    *pbVar9 = (((a2.m_floats[lVar8] + (body1_trans->m_origin).m_floats[lVar8]) - a1.m_floats[lVar8])
              - (body0_trans->m_origin).m_floats[lVar8]) * fVar1 * fVar2;
    lVar8 = lVar8 + 1;
    pbVar9 = pbVar9 + lVar6;
  } while (lVar8 != 3);
  if ((uVar5 & 2) != 0) {
    pbVar9 = info->cfm;
    bVar4 = this->m_cfm;
    *pbVar9 = bVar4;
    pbVar9[lVar6] = bVar4;
    pbVar9[lVar6 * 2] = bVar4;
  }
  bVar4 = (this->m_setting).m_impulseClamp;
  lVar8 = 2;
  lVar7 = 0;
  bVar11 = bVar4;
  while( true ) {
    if (0.0 < bVar11) {
      *(float *)((long)info->m_lowerLimit + lVar7) = -bVar4;
      *(btScalar *)((long)info->m_upperLimit + lVar7) = bVar4;
    }
    bVar10 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar10) break;
    bVar11 = (this->m_setting).m_impulseClamp;
    lVar7 = lVar7 + lVar6 * 4;
  }
  info->m_damping = (this->m_setting).m_damping;
  return;
}

Assistant:

void btPoint2PointConstraint::getInfo2NonVirtual (btConstraintInfo2* info, const btTransform& body0_trans, const btTransform& body1_trans)
{
	btAssert(!m_useSolveConstraintObsolete);

	 //retrieve matrices

	// anchor points in global coordinates with respect to body PORs.
   
    // set jacobian
    info->m_J1linearAxis[0] = 1;
	info->m_J1linearAxis[info->rowskip+1] = 1;
	info->m_J1linearAxis[2*info->rowskip+2] = 1;

	btVector3 a1 = body0_trans.getBasis()*getPivotInA();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    
	info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	
	btVector3 a2 = body1_trans.getBasis()*getPivotInB();
   
	{
	//	btVector3 a2n = -a2;
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    


    // set right hand side
	btScalar currERP = (m_flags & BT_P2P_FLAGS_ERP) ? m_erp : info->erp;
    btScalar k = info->fps * currERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + body1_trans.getOrigin()[j] - a1[j] - body0_trans.getOrigin()[j]);
		//printf("info->m_constraintError[%d]=%f\n",j,info->m_constraintError[j]);
    }
	if(m_flags & BT_P2P_FLAGS_CFM)
	{
		for (j=0; j<3; j++)
		{
			info->cfm[j*info->rowskip] = m_cfm;
		}
	}

	btScalar impulseClamp = m_setting.m_impulseClamp;//
	for (j=0; j<3; j++)
    {
		if (m_setting.m_impulseClamp > 0)
		{
			info->m_lowerLimit[j*info->rowskip] = -impulseClamp;
			info->m_upperLimit[j*info->rowskip] = impulseClamp;
		}
	}
	info->m_damping = m_setting.m_damping;
	
}